

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_suite.cpp
# Opt level: O0

void formatter_suite::run(void)

{
  format_null();
  format_boolean();
  format_integer();
  format_real();
  format_string();
  format_array();
  format_array_nested_array();
  format_array_nested_map();
  format_map();
  format_map_nested_array();
  format_map_nested_map();
  return;
}

Assistant:

void run()
{
    format_null();
    format_boolean();
    format_integer();
    format_real();
    format_string();
    format_array();
    format_array_nested_array();
    format_array_nested_map();
    format_map();
    format_map_nested_array();
    format_map_nested_map();
}